

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode
SUNAdaptController_EstimateStep_Soderlind
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double dVar3;
  int iVar4;
  double *in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  sunrealtype hrat2;
  sunrealtype hrat;
  sunrealtype e3;
  sunrealtype e2;
  sunrealtype e1;
  sunrealtype k5;
  sunrealtype k4;
  sunrealtype k3;
  sunrealtype k2;
  sunrealtype k1;
  int ord;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  
  iVar4 = in_ESI + 1;
  dVar5 = -*(double *)*in_RDI / (double)iVar4;
  dVar6 = -*(double *)(*in_RDI + 8) / (double)iVar4;
  dVar8 = *(double *)(*in_RDI + 0x10);
  uVar1 = *(undefined8 *)(*in_RDI + 0x18);
  uVar2 = *(undefined8 *)(*in_RDI + 0x20);
  if (*(double *)(*in_RDI + 0x28) * in_XMM1_Qa <= 1e-10) {
    local_90 = 1e-10;
  }
  else {
    local_90 = *(double *)(*in_RDI + 0x28) * in_XMM1_Qa;
  }
  if (*(double *)(*in_RDI + 0x30) <= 1e-10) {
    local_98 = 0x3ddb7cdfd9d7bdbb;
  }
  else {
    local_98 = *(undefined8 *)(*in_RDI + 0x30);
  }
  if (*(double *)(*in_RDI + 0x38) <= 1e-10) {
    local_a0 = 0x3ddb7cdfd9d7bdbb;
  }
  else {
    local_a0 = *(undefined8 *)(*in_RDI + 0x38);
  }
  dVar7 = in_XMM0_Qa / *(double *)(*in_RDI + 0x40);
  dVar9 = *(double *)(*in_RDI + 0x40);
  dVar3 = *(double *)(*in_RDI + 0x48);
  if (*(int *)(*in_RDI + 0x50) < 1) {
    dVar8 = (double)SUNRpowerR(local_90,dVar5);
    *in_RDX = in_XMM0_Qa * dVar8;
  }
  else if (*(int *)(*in_RDI + 0x50) < 2) {
    dVar8 = (double)SUNRpowerR(local_90,dVar5);
    dVar5 = (double)SUNRpowerR(local_98,dVar6);
    dVar6 = (double)SUNRpowerR(dVar7,uVar1);
    *in_RDX = in_XMM0_Qa * dVar8 * dVar5 * dVar6;
  }
  else {
    dVar5 = (double)SUNRpowerR(local_90,dVar5);
    dVar6 = (double)SUNRpowerR(local_98,dVar6);
    dVar8 = (double)SUNRpowerR(local_a0,-dVar8 / (double)iVar4);
    dVar7 = (double)SUNRpowerR(dVar7,uVar1);
    dVar9 = (double)SUNRpowerR(dVar9 / dVar3,uVar2);
    *in_RDX = in_XMM0_Qa * dVar5 * dVar6 * dVar8 * dVar7 * dVar9;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_Soderlind(SUNAdaptController C,
                                                     sunrealtype h, int p,
                                                     sunrealtype dsm,
                                                     sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);

  /* order parameter to use */
  const int ord = p + 1;

  /* set usable time-step adaptivity parameters */
  const sunrealtype k1    = -SODERLIND_K1(C) / ord;
  const sunrealtype k2    = -SODERLIND_K2(C) / ord;
  const sunrealtype k3    = -SODERLIND_K3(C) / ord;
  const sunrealtype k4    = SODERLIND_K4(C);
  const sunrealtype k5    = SODERLIND_K5(C);
  const sunrealtype e1    = SUNMAX(SODERLIND_BIAS(C) * dsm, TINY);
  const sunrealtype e2    = SUNMAX(SODERLIND_EP(C), TINY);
  const sunrealtype e3    = SUNMAX(SODERLIND_EPP(C), TINY);
  const sunrealtype hrat  = h / SODERLIND_HP(C);
  const sunrealtype hrat2 = SODERLIND_HP(C) / SODERLIND_HPP(C);

  /* compute estimated optimal time step size */
  if (SODERLIND_FIRSTSTEPS(C) < 1) { *hnew = h * SUNRpowerR(e1, k1); }
  else if (SODERLIND_FIRSTSTEPS(C) < 2)
  {
    *hnew = h * SUNRpowerR(e1, k1) * SUNRpowerR(e2, k2) * SUNRpowerR(hrat, k4);
  }
  else
  {
    *hnew = h * SUNRpowerR(e1, k1) * SUNRpowerR(e2, k2) * SUNRpowerR(e3, k3) *
            SUNRpowerR(hrat, k4) * SUNRpowerR(hrat2, k5);
  }

  /* return with success */
  return SUN_SUCCESS;
}